

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_context.cpp
# Opt level: O3

Node * __thiscall
ccs::TallyBuildContext<ccs::AndTally>::traverse
          (TallyBuildContext<ccs::AndTally> *this,SelectorLeaf *selector)

{
  int iVar1;
  undefined4 extraout_var;
  Node *pNVar2;
  shared_ptr<ccs::AndTally> tally;
  set<std::shared_ptr<ccs::Tally>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
  tallies;
  undefined1 local_89;
  AndTally *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  shared_ptr<ccs::AndTally> local_78;
  shared_ptr<ccs::AndTally> local_68;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Rb_tree<std::shared_ptr<ccs::Tally>,_std::shared_ptr<ccs::Tally>,_std::_Identity<std::shared_ptr<ccs::Tally>_>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
  local_48;
  Node *__args_1;
  
  local_58 = (this->baseContext_).super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  local_50 = (this->baseContext_).super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_50->_M_use_count = local_50->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_50->_M_use_count = local_50->_M_use_count + 1;
    }
  }
  iVar1 = (*selector->_vptr_SelectorLeaf[2])(selector,&local_58);
  __args_1 = (Node *)CONCAT44(extraout_var,iVar1);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  pNVar2 = this->firstNode_;
  if (pNVar2 != __args_1) {
    local_48._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_48._M_impl.super__Rb_tree_header._M_header;
    local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_48._M_impl.super__Rb_tree_header._M_header._M_right =
         local_48._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    __set_intersection<std::_Rb_tree_const_iterator<std::shared_ptr<ccs::AndTally>>,std::_Rb_tree_const_iterator<std::shared_ptr<ccs::AndTally>>,std::insert_iterator<std::set<std::shared_ptr<ccs::Tally>,std::less<std::shared_ptr<ccs::Tally>>,std::allocator<std::shared_ptr<ccs::Tally>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((pNVar2->andTallies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               &(pNVar2->andTallies_)._M_t._M_impl.super__Rb_tree_header,
               (__args_1->andTallies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               &(__args_1->andTallies_)._M_t._M_impl.super__Rb_tree_header,&local_48);
    if (local_48._M_impl.super__Rb_tree_header._M_node_count == 0) {
      local_88 = (AndTally *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<ccs::AndTally,std::allocator<ccs::AndTally>,ccs::Node&,ccs::Node&>
                (&local_80,&local_88,(allocator<ccs::AndTally> *)&local_89,this->firstNode_,__args_1
                );
      pNVar2 = this->firstNode_;
      local_68.super___shared_ptr<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
      local_68.super___shared_ptr<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_80._M_pi;
      if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
        }
      }
      std::
      _Rb_tree<std::shared_ptr<ccs::AndTally>,std::shared_ptr<ccs::AndTally>,std::_Identity<std::shared_ptr<ccs::AndTally>>,std::less<std::shared_ptr<ccs::AndTally>>,std::allocator<std::shared_ptr<ccs::AndTally>>>
      ::_M_insert_unique<std::shared_ptr<ccs::AndTally>const&>
                ((_Rb_tree<std::shared_ptr<ccs::AndTally>,std::shared_ptr<ccs::AndTally>,std::_Identity<std::shared_ptr<ccs::AndTally>>,std::less<std::shared_ptr<ccs::AndTally>>,std::allocator<std::shared_ptr<ccs::AndTally>>>
                  *)&pNVar2->andTallies_,&local_68);
      if (local_68.super___shared_ptr<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_78.super___shared_ptr<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
      local_78.super___shared_ptr<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_80._M_pi;
      if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
        }
      }
      std::
      _Rb_tree<std::shared_ptr<ccs::AndTally>,std::shared_ptr<ccs::AndTally>,std::_Identity<std::shared_ptr<ccs::AndTally>>,std::less<std::shared_ptr<ccs::AndTally>>,std::allocator<std::shared_ptr<ccs::AndTally>>>
      ::_M_insert_unique<std::shared_ptr<ccs::AndTally>const&>
                ((_Rb_tree<std::shared_ptr<ccs::AndTally>,std::shared_ptr<ccs::AndTally>,std::_Identity<std::shared_ptr<ccs::AndTally>>,std::less<std::shared_ptr<ccs::AndTally>>,std::allocator<std::shared_ptr<ccs::AndTally>>>
                  *)&__args_1->andTallies_,&local_78);
      if (local_78.super___shared_ptr<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pNVar2 = (local_88->super_Tally).node_._M_t.
               super___uniq_ptr_impl<ccs::Node,_std::default_delete<ccs::Node>_>._M_t.
               super__Tuple_impl<0UL,_ccs::Node_*,_std::default_delete<ccs::Node>_>.
               super__Head_base<0UL,_ccs::Node_*,_false>._M_head_impl;
      if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
      }
    }
    else {
      pNVar2 = *(Node **)(*(size_t *)(local_48._M_impl.super__Rb_tree_header._M_header._M_left + 1)
                         + 8);
    }
    std::
    _Rb_tree<std::shared_ptr<ccs::Tally>,_std::shared_ptr<ccs::Tally>,_std::_Identity<std::shared_ptr<ccs::Tally>_>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
    ::~_Rb_tree(&local_48);
  }
  return pNVar2;
}

Assistant:

virtual Node &traverse(ast::SelectorLeaf &selector) {
    Node &secondNode = selector.traverse(baseContext_);

    // we've arrived at the same node by two different paths. no tally is
    // actually needed here...
    if (&firstNode_ == &secondNode) return firstNode_;

    std::set<std::shared_ptr<Tally>> tallies;

    std::set_intersection(
        firstNode_.tallies<T>().begin(), firstNode_.tallies<T>().end(),
        secondNode.tallies<T>().begin(), secondNode.tallies<T>().end(),
        std::inserter(tallies, tallies.end()));

    // result will be either empty or have exactly one entry.

    if (tallies.empty()) {
      std::shared_ptr<T> tally = std::make_shared<T>(firstNode_,
          secondNode);
      firstNode_.addTally(tally);
      secondNode.addTally(tally);
      return tally->node();
    } else {
      return (*tallies.begin())->node();
    }
  }